

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothubtransport_amqp_connection.c
# Opt level: O0

AMQP_CONNECTION_HANDLE amqp_connection_create(AMQP_CONNECTION_CONFIG *config)

{
  int iVar1;
  LOGGER_LOG p_Var2;
  AMQP_CONNECTION_INSTANCE_conflict *instance_00;
  STRING_HANDLE pSVar3;
  LOGGER_LOG l_8;
  LOGGER_LOG l_7;
  LOGGER_LOG l_6;
  LOGGER_LOG l_5;
  LOGGER_LOG l_4;
  LOGGER_LOG l_3;
  AMQP_CONNECTION_INSTANCE_conflict *instance;
  LOGGER_LOG l_2;
  LOGGER_LOG l_1;
  LOGGER_LOG l;
  AMQP_CONNECTION_HANDLE result;
  AMQP_CONNECTION_CONFIG *config_local;
  
  if (config == (AMQP_CONNECTION_CONFIG *)0x0) {
    l = (LOGGER_LOG)0x0;
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 != (LOGGER_LOG)0x0) {
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_connection.c"
                ,"amqp_connection_create",0x139,1,"amqp_connection_create failed (config is NULL)");
    }
  }
  else if (config->iothub_host_fqdn == (char *)0x0) {
    l = (LOGGER_LOG)0x0;
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 != (LOGGER_LOG)0x0) {
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_connection.c"
                ,"amqp_connection_create",0x13e,1,
                "amqp_connection_create failed (config->iothub_host_fqdn is NULL)");
    }
  }
  else if (config->underlying_io_transport == (XIO_HANDLE)0x0) {
    l = (LOGGER_LOG)0x0;
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 != (LOGGER_LOG)0x0) {
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_connection.c"
                ,"amqp_connection_create",0x143,1,
                "amqp_connection_create failed (config->underlying_io_transport is NULL)");
    }
  }
  else {
    instance_00 = (AMQP_CONNECTION_INSTANCE_conflict *)malloc(0x60);
    if (instance_00 == (AMQP_CONNECTION_INSTANCE_conflict *)0x0) {
      l = (LOGGER_LOG)0x0;
      p_Var2 = xlogging_get_log_function();
      if (p_Var2 != (LOGGER_LOG)0x0) {
        (*p_Var2)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_connection.c"
                  ,"amqp_connection_create",0x14c,1,"amqp_connection_create failed (malloc failed)")
        ;
      }
    }
    else {
      memset(instance_00,0,0x60);
      pSVar3 = STRING_construct(config->iothub_host_fqdn);
      instance_00->iothub_fqdn = pSVar3;
      if (pSVar3 == (STRING_HANDLE)0x0) {
        l = (LOGGER_LOG)0x0;
        p_Var2 = xlogging_get_log_function();
        if (p_Var2 != (LOGGER_LOG)0x0) {
          (*p_Var2)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_connection.c"
                    ,"amqp_connection_create",0x155,1,
                    "amqp_connection_create failed (STRING_construct failed)");
        }
      }
      else {
        instance_00->underlying_io_transport = config->underlying_io_transport;
        instance_00->is_trace_on = (_Bool)(config->is_trace_on & 1);
        instance_00->on_state_changed_callback = config->on_state_changed_callback;
        instance_00->on_state_changed_context = config->on_state_changed_context;
        instance_00->has_sasl_mechanism = (_Bool)(config->create_sasl_io & 1);
        instance_00->has_cbs = (_Bool)(config->create_cbs_connection & 1);
        instance_00->svc2cl_keep_alive_timeout_secs =
             (uint32_t)config->svc2cl_keep_alive_timeout_secs;
        instance_00->cl2svc_keep_alive_send_ratio = config->cl2svc_keep_alive_send_ratio;
        instance_00->current_state = AMQP_CONNECTION_STATE_CLOSED;
        if ((((config->create_sasl_io & 1U) == 0) && ((config->create_cbs_connection & 1U) == 0)) ||
           (iVar1 = create_sasl_components(instance_00), iVar1 == 0)) {
          iVar1 = create_connection_handle(instance_00);
          if (iVar1 == 0) {
            iVar1 = create_session_handle(instance_00);
            if (iVar1 == 0) {
              l = (LOGGER_LOG)instance_00;
              if (((config->create_cbs_connection & 1U) != 0) &&
                 (iVar1 = create_cbs_handle(instance_00), iVar1 != 0)) {
                l = (LOGGER_LOG)0x0;
                p_Var2 = xlogging_get_log_function();
                if (p_Var2 != (LOGGER_LOG)0x0) {
                  (*p_Var2)(AZ_LOG_ERROR,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_connection.c"
                            ,"amqp_connection_create",0x177,1,
                            "amqp_connection_create failed (failed creating the CBS handle)");
                }
              }
            }
            else {
              l = (LOGGER_LOG)0x0;
              p_Var2 = xlogging_get_log_function();
              if (p_Var2 != (LOGGER_LOG)0x0) {
                (*p_Var2)(AZ_LOG_ERROR,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_connection.c"
                          ,"amqp_connection_create",0x172,1,
                          "amqp_connection_create failed (failed creating the AMQP session)");
              }
            }
          }
          else {
            l = (LOGGER_LOG)0x0;
            p_Var2 = xlogging_get_log_function();
            if (p_Var2 != (LOGGER_LOG)0x0) {
              (*p_Var2)(AZ_LOG_ERROR,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_connection.c"
                        ,"amqp_connection_create",0x16d,1,
                        "amqp_connection_create failed (failed creating the AMQP connection)");
            }
          }
        }
        else {
          l = (LOGGER_LOG)0x0;
          p_Var2 = xlogging_get_log_function();
          if (p_Var2 != (LOGGER_LOG)0x0) {
            (*p_Var2)(AZ_LOG_ERROR,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_connection.c"
                      ,"amqp_connection_create",0x168,1,
                      "amqp_connection_create failed (failed creating the SASL components)");
          }
        }
      }
      if (l == (LOGGER_LOG)0x0) {
        amqp_connection_destroy(instance_00);
      }
    }
  }
  return (AMQP_CONNECTION_HANDLE)l;
}

Assistant:

AMQP_CONNECTION_HANDLE amqp_connection_create(AMQP_CONNECTION_CONFIG* config)
{
    AMQP_CONNECTION_HANDLE result;

    if (config == NULL)
    {
        result = NULL;
        LogError("amqp_connection_create failed (config is NULL)");
    }
    else if (config->iothub_host_fqdn == NULL)
    {
        result = NULL;
        LogError("amqp_connection_create failed (config->iothub_host_fqdn is NULL)");
    }
    else if (config->underlying_io_transport == NULL)
    {
        result = NULL;
        LogError("amqp_connection_create failed (config->underlying_io_transport is NULL)");
    }
    else
    {
        AMQP_CONNECTION_INSTANCE* instance;

        if ((instance = (AMQP_CONNECTION_INSTANCE*)malloc(sizeof(AMQP_CONNECTION_INSTANCE))) == NULL)
        {
            result = NULL;
            LogError("amqp_connection_create failed (malloc failed)");
        }
        else
        {
            memset(instance, 0, sizeof(AMQP_CONNECTION_INSTANCE));

            if ((instance->iothub_fqdn = STRING_construct(config->iothub_host_fqdn)) == NULL)
            {
                result = NULL;
                LogError("amqp_connection_create failed (STRING_construct failed)");
            }
            else
            {
                instance->underlying_io_transport = config->underlying_io_transport;
                instance->is_trace_on = config->is_trace_on;
                instance->on_state_changed_callback = config->on_state_changed_callback;
                instance->on_state_changed_context = config->on_state_changed_context;
                instance->has_sasl_mechanism = config->create_sasl_io;
                instance->has_cbs = config->create_cbs_connection;

                instance->svc2cl_keep_alive_timeout_secs = (uint32_t)config->svc2cl_keep_alive_timeout_secs;
                instance->cl2svc_keep_alive_send_ratio = (double)config->cl2svc_keep_alive_send_ratio;

                instance->current_state = AMQP_CONNECTION_STATE_CLOSED;

                if ((config->create_sasl_io || config->create_cbs_connection) && create_sasl_components(instance) != RESULT_OK)
                {
                    result = NULL;
                    LogError("amqp_connection_create failed (failed creating the SASL components)");
                }
                else if (create_connection_handle(instance) != RESULT_OK)
                {
                    result = NULL;
                    LogError("amqp_connection_create failed (failed creating the AMQP connection)");
                }
                else if (create_session_handle(instance) != RESULT_OK)
                {
                    result = NULL;
                    LogError("amqp_connection_create failed (failed creating the AMQP session)");
                }
                else if (config->create_cbs_connection && create_cbs_handle(instance) != RESULT_OK)
                {
                    result = NULL;
                    LogError("amqp_connection_create failed (failed creating the CBS handle)");
                }
                else
                {
                    result = (AMQP_CONNECTION_HANDLE)instance;
                }
            }

            if (result == NULL)
            {
                amqp_connection_destroy((AMQP_CONNECTION_HANDLE)instance);
            }
        }
    }

    return result;
}